

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iptables.c
# Opt level: O0

ip_chain_t * parse_chain(char *str,ip_table_t *ipt)

{
  int iVar1;
  ip_chain_t *local_58;
  ip_chain_t *ipc;
  char local_48 [4];
  int type;
  char policy [16];
  char name [32];
  ip_table_t *ipt_local;
  char *str_local;
  
  memset(policy + 8,0,0x20);
  memset(local_48,0,0x10);
  local_58 = (ip_chain_t *)0x0;
  iVar1 = __isoc99_sscanf(str,":%31s %15s",policy + 8,local_48);
  if (iVar1 == 2) {
    local_58 = (ip_chain_t *)new(0x48);
    _strlcpy((char *)local_58,policy + 8,0x20);
    iVar1 = map_int_get_v(local_48,m_target);
    local_58->policy = iVar1;
    INIT_LIST_HEAD(&local_58->list);
    INIT_LIST_HEAD(&local_58->rules);
    iVar1 = map_int_get_v((char *)local_58,m_chain);
    if (iVar1 == 5) {
      list_add_tail(&local_58->list,&ipt->child_chains);
    }
    else {
      ipt->chains[iVar1] = local_58;
    }
  }
  return local_58;
}

Assistant:

static ip_chain_t *parse_chain(char *str, ip_table_t *ipt)
{
	char name[MAX_CHAIN_NAME_LEN] = {0}, policy[16] = {0};
	int type = CHAIN_NONE;
	ip_chain_t *ipc = NULL;

	if (sscanf(str, ":%31s %15s", name, policy) == 2) {

		ipc = _new(ip_chain_t);

		_strlcpy(ipc->name, name, sizeof(ipc->name));
		ipc->policy = map_int_get_v(policy, m_target);

		INIT_LIST_HEAD(&ipc->list);
		INIT_LIST_HEAD(&ipc->rules);

		type = map_int_get_v(ipc->name, m_chain);

		if (type == CHAIN_NONE) {
			list_add_tail(&ipc->list, &ipt->child_chains);
		} else {
			ipt->chains[type] = ipc;
		}
	}

	return ipc;
}